

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<QTextLayout::FormatRange>::remove(QList<QTextLayout::FormatRange> *this,char *__filename)

{
  QList<QTextLayout::FormatRange> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  FormatRange *in_stack_00000018;
  QMovableArrayOps<QTextLayout::FormatRange> *in_stack_00000020;
  QArrayDataPointer<QTextLayout::FormatRange> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QTextLayout::FormatRange>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QTextLayout::FormatRange>::operator->(&this->d);
    QArrayDataPointer<QTextLayout::FormatRange>::operator->(&this->d);
    QArrayDataPointer<QTextLayout::FormatRange>::begin
              ((QArrayDataPointer<QTextLayout::FormatRange> *)0x79db89);
    QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}